

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O1

BOOL DBG_get_indent(DBG_LEVEL_ID level,char *format,char *indent_string)

{
  FILE *__stream;
  uint __errnum;
  void *pvVar1;
  char *pcVar2;
  void *pvVar3;
  
  if (((level != DLI_EXIT) && (level != DLI_ENTRY)) || (max_entry_level == 0)) goto LAB_0033a7be;
  pvVar1 = pthread_getspecific(entry_level_key);
  if (level == DLI_EXIT) {
    if (pvVar1 != (void *)0x0) {
      pvVar3 = (void *)((long)pvVar1 + -1);
      pvVar1 = pvVar3;
      goto LAB_0033a755;
    }
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar3 = (void *)((long)pvVar1 + 1);
LAB_0033a755:
    __errnum = pthread_setspecific(entry_level_key,pvVar3);
    __stream = _stderr;
    if (__errnum != 0) {
      pcVar2 = strerror(__errnum);
      fprintf(__stream,"ERROR : pthread_setspecific() failed error:%d (%s)\n",(ulong)__errnum,pcVar2
             );
    }
  }
  if ((long)max_entry_level <= (long)pvVar1) {
    return 0;
  }
  pvVar3 = (void *)0x32;
  if ((long)pvVar1 < 0x32) {
    pvVar3 = pvVar1;
  }
  memset(format,0x2e,(size_t)pvVar3);
  format = format + (long)pvVar3;
LAB_0033a7be:
  *format = '\0';
  return 1;
}

Assistant:

static BOOL DBG_get_indent(DBG_LEVEL_ID level, const char *format,
                           char *indent_string)
{
    int ret;

    /* determine whether to output an ENTRY line */
    if(DLI_ENTRY == level||DLI_EXIT == level)
    {
        if(0 != max_entry_level)
        {
            INT_PTR nesting;

            /* Determine if this is an entry or an
               exit */
            if(DLI_EXIT == level)
            {
                nesting = (INT_PTR) pthread_getspecific(entry_level_key);
                /* avoid going negative */
                if(nesting != 0)
                {
                    nesting--;
                    if ((ret = pthread_setspecific(entry_level_key,
                                                     (LPVOID)nesting)) != 0)
                    {
                        fprintf(stderr, "ERROR : pthread_setspecific() failed "
                                "error:%d (%s)\n", ret, strerror(ret));
                    }
                }
            }
            else
            {
                nesting = (INT_PTR) pthread_getspecific(entry_level_key);

                if ((ret = pthread_setspecific(entry_level_key,
                                                 (LPVOID)(nesting+1))) != 0)
                {
                    fprintf(stderr, "ERROR : pthread_setspecific() failed "
                            "error:%d (%s)\n", ret, strerror(ret));
                }
            }

            /* see if we're past the level treshold */
            if(nesting >= max_entry_level)
            {
                return FALSE;
            }

            /* generate indentation string */
            if(MAX_NESTING < nesting)
            {
                nesting = MAX_NESTING;
            }
            memset(indent_string,INDENT_CHAR ,nesting);
            indent_string[nesting] = '\0';
        }
        else
        {
            indent_string[0] = '\0';
        }
    }
    else
    {
        indent_string[0] = '\0';
    }
    return TRUE;
}